

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanSyncObjectManager.cpp
# Opt level: O3

void __thiscall
VulkanUtilities::VulkanSyncObjectManager::CreateSemaphores
          (VulkanSyncObjectManager *this,VulkanRecycledSemaphore *pSemaphores,uint32_t Count)

{
  int iVar1;
  pointer ppVVar2;
  RecycledSyncObject<VulkanUtilities::VkSemaphoreType> *this_00;
  ulong uVar3;
  ulong uVar4;
  VulkanRecycledSemaphore *this_01;
  VkSemaphore vkSem;
  VkSemaphoreCreateInfo SemCI;
  VkSemaphore local_90;
  RecycledSyncObject<VulkanUtilities::VkSemaphoreType> local_88;
  element_type *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  VkSemaphoreCreateInfo local_48;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_SemaphorePoolGuard);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  if (Count == 0) {
    uVar4 = 0;
  }
  else {
    ppVVar2 = (this->m_SemaphorePool).
              super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    uVar3 = 0;
    this_01 = pSemaphores;
    do {
      uVar4 = uVar3;
      if ((this->m_SemaphorePool).
          super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
          super__Vector_impl_data._M_start == ppVVar2) break;
      std::__shared_ptr<VulkanUtilities::VulkanSyncObjectManager,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<VulkanUtilities::VulkanSyncObjectManager,void>
                ((__shared_ptr<VulkanUtilities::VulkanSyncObjectManager,(__gnu_cxx::_Lock_policy)2>
                  *)&local_58,
                 (__weak_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2> *
                 )this);
      local_88.m_VkSyncObject =
           (this->m_SemaphorePool).
           super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
           super__Vector_impl_data._M_finish[-1];
      local_88.m_pManager.
      super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = local_58;
      local_88.m_pManager.
      super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = local_50;
      if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_50->_M_use_count = local_50->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_50->_M_use_count = local_50->_M_use_count + 1;
        }
      }
      local_88.m_IsUnsignaled = false;
      RecycledSyncObject<VulkanUtilities::VkSemaphoreType>::operator=(this_01,&local_88);
      RecycledSyncObject<VulkanUtilities::VkSemaphoreType>::~RecycledSyncObject(&local_88);
      if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
      }
      ppVVar2 = (this->m_SemaphorePool).
                super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
                super__Vector_impl_data._M_finish + -1;
      (this->m_SemaphorePool).super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = ppVVar2;
      uVar3 = uVar3 + 1;
      this_01 = this_01 + 1;
      uVar4 = (ulong)Count;
    } while (Count != uVar3);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_SemaphorePoolGuard);
  local_48.pNext = (void *)0x0;
  local_48.flags = 0;
  local_48._20_4_ = 0;
  local_48.sType = VK_STRUCTURE_TYPE_SEMAPHORE_CREATE_INFO;
  local_48._4_4_ = 0;
  iVar1 = Count - (uint)uVar4;
  if ((uint)uVar4 <= Count && iVar1 != 0) {
    this_00 = pSemaphores + (uVar4 & 0xffffffff);
    do {
      local_90 = (VkSemaphore_T *)0x0;
      (*vkCreateSemaphore)
                (this->m_LogicalDevice->m_VkDevice,&local_48,(VkAllocationCallbacks *)0x0,&local_90)
      ;
      std::__shared_ptr<VulkanUtilities::VulkanSyncObjectManager,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<VulkanUtilities::VulkanSyncObjectManager,void>
                ((__shared_ptr<VulkanUtilities::VulkanSyncObjectManager,(__gnu_cxx::_Lock_policy)2>
                  *)&local_68,
                 (__weak_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2> *
                 )this);
      local_88.m_pManager.
      super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = local_68;
      local_88.m_pManager.
      super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = local_60;
      if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_60->_M_use_count = local_60->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_60->_M_use_count = local_60->_M_use_count + 1;
        }
      }
      local_88.m_VkSyncObject = local_90;
      local_88.m_IsUnsignaled = false;
      RecycledSyncObject<VulkanUtilities::VkSemaphoreType>::operator=(this_00,&local_88);
      RecycledSyncObject<VulkanUtilities::VkSemaphoreType>::~RecycledSyncObject(&local_88);
      if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
      }
      this_00 = this_00 + 1;
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  return;
}

Assistant:

void VulkanSyncObjectManager::CreateSemaphores(VulkanRecycledSemaphore* pSemaphores, uint32_t Count)
{
    uint32_t SemIdx = 0;
    {
        std::lock_guard<std::mutex> Lock{m_SemaphorePoolGuard};
        for (; SemIdx < Count && !m_SemaphorePool.empty(); ++SemIdx)
        {
            pSemaphores[SemIdx] = VulkanRecycledSemaphore{shared_from_this(), m_SemaphorePool.back()};
            m_SemaphorePool.pop_back();
        }
    }

    // Create new semaphores.
    VkSemaphoreCreateInfo SemCI{};
    SemCI.sType = VK_STRUCTURE_TYPE_SEMAPHORE_CREATE_INFO;

    for (; SemIdx < Count; ++SemIdx)
    {
        VkSemaphore vkSem = VK_NULL_HANDLE;
        vkCreateSemaphore(m_LogicalDevice.GetVkDevice(), &SemCI, nullptr, &vkSem);
        pSemaphores[SemIdx] = VulkanRecycledSemaphore{shared_from_this(), vkSem};
    }
}